

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_item(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
         item_event_visitor *visitor,error_code *ec)

{
  pointer pvVar1;
  ulong uVar2;
  cbor_errc __e;
  semantic_tag tag;
  byte bVar3;
  char_result<unsigned_char> cVar4;
  uint64_t uVar5;
  int64_t iVar6;
  reference pvVar7;
  _func_int **pp_Var8;
  size_t length;
  undefined8 uVar9;
  type tVar10;
  undefined8 uStack_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  read_byte_string_from_buffer local_30;
  
  read_tags(this,ec);
  if (ec->_M_value != 0) {
    return;
  }
  cVar4 = stream_source<unsigned_char>::peek(&this->source_);
  if (((ushort)cVar4 >> 8 & 1) != 0) {
    __e = unexpected_eof;
LAB_001fd81c:
    std::error_code::operator=(ec,__e);
    this->more_ = false;
    return;
  }
  bVar3 = cVar4.value & 0x1f;
  switch((byte)((ushort)cVar4 >> 5) & 7) {
  case 0:
    uVar5 = get_uint64_value(this,ec);
    if (ec->_M_value != 0) {
      return;
    }
    pvVar1 = (this->stringref_map_stack_).
             super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    uVar2 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
    if ((uVar2 & 1) != 0 &&
        (this->stringref_map_stack_).
        super__Vector_base<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>,_std::allocator<std::vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pvVar1) {
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar2 & 0xfffffffffffffffe;
      if ((ulong)((long)pvVar1[-1].
                        super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)pvVar1[-1].
                        super__Vector_base<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar5) {
        __e = stringref_too_large;
        goto LAB_001fd81c;
      }
      pvVar7 = std::
               vector<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string,_std::allocator<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::mapped_string>_>
               ::at(pvVar1 + -1,uVar5);
      if (pvVar7->type == text_string) {
        local_40._M_str = (pvVar7->str)._M_dataplus._M_p;
        local_40._M_len = (pvVar7->str)._M_string_length;
        goto LAB_001fd7c9;
      }
      local_30.bytes.data_ =
           (pvVar7->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
      local_30.bytes.size_ =
           (long)(pvVar7->bytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)local_30.bytes.data_;
      basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
      write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_buffer>
                ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
                 this,&local_30,visitor,ec);
      goto LAB_001fd7d7;
    }
    if ((uVar2 & 4) == 0) {
      bVar3 = 0;
    }
    else {
      bVar3 = (this->raw_tag_ == 1) * '\x05';
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar2 & 0xfffffffffffffffb;
    }
    (*visitor->_vptr_basic_item_event_visitor[0xe])(visitor,uVar5,(ulong)bVar3,this,ec);
    goto LAB_001fd905;
  case 1:
    iVar6 = get_int64_value(this,ec);
    if (ec->_M_value != 0) {
      return;
    }
    uVar2 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
    if ((uVar2 & 4) == 0) {
      bVar3 = 0;
    }
    else {
      bVar3 = (this->raw_tag_ == 1) * '\x05';
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar2 & 0xfffffffffffffffb;
    }
    (*visitor->_vptr_basic_item_event_visitor[0xf])(visitor,iVar6,(ulong)bVar3,this,ec);
    goto LAB_001fd905;
  case 2:
    basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::
    write_byte_string<jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>>::read_byte_string_from_source>
              ((basic_cbor_parser<jsoncons::stream_source<unsigned_char>,std::allocator<char>> *)
               this,(read_byte_string_from_source)this,visitor,ec);
    goto LAB_001fd7d7;
  case 3:
    (this->text_buffer_)._M_string_length = 0;
    *(this->text_buffer_)._M_dataplus._M_p = '\0';
    read_text_string(this,&this->text_buffer_,ec);
    if (ec->_M_value != 0) {
      return;
    }
    tVar10 = unicode_traits::validate<char>
                       ((unicode_traits *)(this->text_buffer_)._M_dataplus._M_p,
                        (char *)(this->text_buffer_)._M_string_length,length);
    if (tVar10.ec != success) {
      __e = invalid_utf8_text_string;
      goto LAB_001fd81c;
    }
    local_40._M_str = (this->text_buffer_)._M_dataplus._M_p;
    local_40._M_len = (this->text_buffer_)._M_string_length;
LAB_001fd7c9:
    handle_string(this,visitor,&local_40,ec);
LAB_001fd7d7:
    if (ec->_M_value != 0) {
      return;
    }
    break;
  case 4:
    if (((this->other_tags_).super__Base_bitset<1UL>._M_w & 4) == 0) {
      begin_array(this,visitor,bVar3,ec);
      break;
    }
    uVar5 = this->raw_tag_;
    if (uVar5 == 0x410) {
      tag = multi_dim_column_major;
LAB_001fd978:
      produce_begin_multi_dim(this,visitor,tag,ec);
    }
    else if (uVar5 == 5) {
      (this->text_buffer_)._M_string_length = 0;
      *(this->text_buffer_)._M_dataplus._M_p = '\0';
      read_bigfloat(this,&this->text_buffer_,ec);
      if (ec->_M_value != 0) {
        return;
      }
      local_40._M_str = (this->text_buffer_)._M_dataplus._M_p;
      local_40._M_len = (this->text_buffer_)._M_string_length;
      pp_Var8 = visitor->_vptr_basic_item_event_visitor;
      uStack_50 = 10;
LAB_001fd95b:
      (*pp_Var8[0xb])(visitor,&local_40,uStack_50,this,ec);
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
    }
    else {
      if (uVar5 == 0x28) {
        tag = multi_dim_row_major;
        goto LAB_001fd978;
      }
      if (uVar5 == 4) {
        (this->text_buffer_)._M_string_length = 0;
        *(this->text_buffer_)._M_dataplus._M_p = '\0';
        read_decimal_fraction(this,&this->text_buffer_,ec);
        if (ec->_M_value != 0) {
          return;
        }
        local_40._M_str = (this->text_buffer_)._M_dataplus._M_p;
        local_40._M_len = (this->text_buffer_)._M_string_length;
        pp_Var8 = visitor->_vptr_basic_item_event_visitor;
        uStack_50 = 3;
        goto LAB_001fd95b;
      }
      begin_array(this,visitor,bVar3,ec);
    }
    *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
         (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w & 0xfb;
    break;
  case 5:
    begin_object(this,visitor,bVar3,ec);
    break;
  case 7:
    switch(bVar3) {
    case 0x14:
      pp_Var8 = visitor->_vptr_basic_item_event_visitor;
      uVar9 = 0;
      goto LAB_001fd841;
    case 0x15:
      pp_Var8 = visitor->_vptr_basic_item_event_visitor;
      uVar9 = 1;
LAB_001fd841:
      (*pp_Var8[10])(visitor,uVar9,0,this,ec);
LAB_001fd86a:
      this->more_ = (bool)(this->cursor_mode_ ^ 1);
      stream_source<unsigned_char>::ignore(&this->source_,1);
      goto switchD_001fd562_caseD_6;
    case 0x16:
      pp_Var8 = visitor->_vptr_basic_item_event_visitor;
      uVar9 = 0;
      goto LAB_001fd861;
    case 0x17:
      pp_Var8 = visitor->_vptr_basic_item_event_visitor;
      uVar9 = 0xd;
LAB_001fd861:
      (*pp_Var8[9])(visitor,uVar9,this,ec);
      goto LAB_001fd86a;
    default:
      __e = unknown_type;
      goto LAB_001fd81c;
    case 0x19:
      uVar5 = get_uint64_value(this,ec);
      if (ec->_M_value != 0) {
        return;
      }
      (*visitor->_vptr_basic_item_event_visitor[0x10])(visitor,uVar5 & 0xffff,0,this,ec);
      break;
    case 0x1a:
    case 0x1b:
      get_double(this,ec);
      if (ec->_M_value != 0) {
        return;
      }
      uVar2 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
      if ((uVar2 & 4) == 0) {
        bVar3 = 0;
      }
      else {
        bVar3 = (this->raw_tag_ == 1) * '\x05';
        (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar2 & 0xfffffffffffffffb;
      }
      (*visitor->_vptr_basic_item_event_visitor[0x11])(visitor,(ulong)bVar3,this,ec);
    }
LAB_001fd905:
    this->more_ = (bool)(this->cursor_mode_ ^ 1);
  }
switchD_001fd562_caseD_6:
  *(byte *)&(this->other_tags_).super__Base_bitset<1UL>._M_w =
       (byte)(this->other_tags_).super__Base_bitset<1UL>._M_w & 0xfb;
  return;
}

Assistant:

void read_item(item_event_visitor& visitor, std::error_code& ec)
    {
        read_tags(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);
        uint8_t info = get_additional_information_value(c.value);

        switch (major_type)
        {
            case jsoncons::cbor::detail::cbor_major_type::unsigned_integer:
            {
                uint64_t val = get_uint64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                if (!stringref_map_stack_.empty() && other_tags_[stringref_tag])
                {
                    other_tags_[stringref_tag] = false;
                    if (val >= stringref_map_stack_.back().size())
                    {
                        ec = cbor_errc::stringref_too_large;
                        more_ = false;
                        return;
                    }
                    auto index = static_cast<typename stringref_map::size_type>(val);
                    if (index != val)
                    {
                        ec = cbor_errc::number_too_large;
                        more_ = false;
                        return;
                    }
                    auto& str = stringref_map_stack_.back().at(index);
                    switch (str.type)
                    {
                        case jsoncons::cbor::detail::cbor_major_type::text_string:
                        {
                            handle_string(visitor, jsoncons::basic_string_view<char>(str.str.data(),str.str.length()),ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            break;
                        }
                        case jsoncons::cbor::detail::cbor_major_type::byte_string:
                        {
                            read_byte_string_from_buffer read(byte_string_view(str.bytes));
                            write_byte_string(read, visitor, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            break;
                        }
                        default:
                            JSONCONS_UNREACHABLE();
                            break;
                    }
                }
                else
                {
                    semantic_tag tag = semantic_tag::none;
                    if (other_tags_[item_tag])
                    {
                        if (raw_tag_ == 1)
                        {
                            tag = semantic_tag::epoch_second;
                        }
                        other_tags_[item_tag] = false;
                    }
                    visitor.uint64_value(val, tag, *this, ec);
                    more_ = !cursor_mode_;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::negative_integer:
            {
                int64_t val = get_int64_value(ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                semantic_tag tag = semantic_tag::none;
                if (other_tags_[item_tag])
                {
                    if (raw_tag_ == 1)
                    {
                        tag = semantic_tag::epoch_second;
                    }
                    other_tags_[item_tag] = false;
                }
                visitor.int64_value(val, tag, *this, ec);
                more_ = !cursor_mode_;
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::byte_string:
            {
                read_byte_string_from_source read(this);
                write_byte_string(read, visitor, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::text_string:
            {
                text_buffer_.clear();

                read_text_string(text_buffer_, ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                auto result = unicode_traits::validate(text_buffer_.data(),text_buffer_.size());
                if (result.ec != unicode_traits::conv_errc())
                {
                    ec = cbor_errc::invalid_utf8_text_string;
                    more_ = false;
                    return;
                }
                handle_string(visitor, jsoncons::basic_string_view<char>(text_buffer_.data(),text_buffer_.length()),ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    return;
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::semantic_tag:
            {
                JSONCONS_UNREACHABLE();
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::simple:
            {
                switch (info)
                {
                    case 0x14:
                        visitor.bool_value(false, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x15:
                        visitor.bool_value(true, semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x16:
                        visitor.null_value(semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x17:
                        visitor.null_value(semantic_tag::undefined, *this, ec);
                        more_ = !cursor_mode_;
                        source_.ignore(1);
                        break;
                    case 0x19: // Half-Precision Float (two-byte IEEE 754)
                    {
                        uint64_t val = get_uint64_value(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        visitor.half_value(static_cast<uint16_t>(val), semantic_tag::none, *this, ec);
                        more_ = !cursor_mode_;
                        break;
                    }
                    case 0x1a: // Single-Precision Float (four-byte IEEE 754)
                    case 0x1b: // Double-Precision Float (eight-byte IEEE 754)
                    {
                        double val = get_double(ec);
                        if (JSONCONS_UNLIKELY(ec))
                        {
                            return;
                        }
                        semantic_tag tag = semantic_tag::none;
                        if (other_tags_[item_tag])
                        {
                            if (raw_tag_ == 1)
                            {
                                tag = semantic_tag::epoch_second;
                            }
                            other_tags_[item_tag] = false;
                        }
                        visitor.double_value(val, tag, *this, ec);
                        more_ = !cursor_mode_;
                        break;
                    }
                    default:
                    {
                        ec = cbor_errc::unknown_type;
                        more_ = false;
                        return;
                    }
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::array:
            {
                if (other_tags_[item_tag])
                {
                    switch (raw_tag_)
                    {
                        case 0x04:
                            text_buffer_.clear();
                            read_decimal_fraction(text_buffer_, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            visitor.string_value(text_buffer_, semantic_tag::bigdec, *this, ec);
                            more_ = !cursor_mode_;
                            break;
                        case 0x05:
                            text_buffer_.clear();
                            read_bigfloat(text_buffer_, ec);
                            if (JSONCONS_UNLIKELY(ec))
                            {
                                return;
                            }
                            visitor.string_value(text_buffer_, semantic_tag::bigfloat, *this, ec);
                            more_ = !cursor_mode_;
                            break;
                        case 40: // row major storage
                            produce_begin_multi_dim(visitor, semantic_tag::multi_dim_row_major, ec);
                            break;
                        case 1040: // column major storage
                            produce_begin_multi_dim(visitor, semantic_tag::multi_dim_column_major, ec);
                            break;
                        default:
                            begin_array(visitor, info, ec);
                            break;
                    }
                    other_tags_[item_tag] = false;
                }
                else
                {
                    begin_array(visitor, info, ec);
                }
                break;
            }
            case jsoncons::cbor::detail::cbor_major_type::map:
            {
                begin_object(visitor, info, ec);
                break;
            }
            default:
                break;
        }
        other_tags_[item_tag] = false;
    }